

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void codeInteger(Parse *pParse,Expr *pExpr,int negFlag,int iMem)

{
  int length;
  char *pcVar1;
  char *local_58;
  char *zV;
  char *z;
  i64 value;
  int c;
  int i;
  Vdbe *v;
  int iMem_local;
  int negFlag_local;
  Expr *pExpr_local;
  Parse *pParse_local;
  
  _c = pParse->pVdbe;
  v._0_4_ = iMem;
  v._4_4_ = negFlag;
  _iMem_local = pExpr;
  pExpr_local = (Expr *)pParse;
  if ((pExpr->flags & 0x400) == 0) {
    pcVar1 = (pExpr->u).zToken;
    length = sqlite3Strlen30(pcVar1);
    value._0_4_ = sqlite3Atoi64(pcVar1,(i64 *)&z,length,'\x01');
    if (((int)value == 0) || (((int)value == 2 && (v._4_4_ != 0)))) {
      if (v._4_4_ != 0) {
        if ((int)value == 2) {
          local_58 = (char *)0x8000000000000000;
        }
        else {
          local_58 = (char *)-(long)z;
        }
        z = local_58;
      }
      pcVar1 = dup8bytes(_c,(char *)&z);
      sqlite3VdbeAddOp4(_c,8,0,(int)v,0,pcVar1,-0xd);
    }
    else {
      codeReal(_c,pcVar1,v._4_4_,(int)v);
    }
  }
  else {
    value._4_4_ = (pExpr->u).iValue;
    if (negFlag != 0) {
      value._4_4_ = -value._4_4_;
    }
    sqlite3VdbeAddOp2(_c,7,value._4_4_,iMem);
  }
  return;
}

Assistant:

static void codeInteger(Parse *pParse, Expr *pExpr, int negFlag, int iMem){
  Vdbe *v = pParse->pVdbe;
  if( pExpr->flags & EP_IntValue ){
    int i = pExpr->u.iValue;
    assert( i>=0 );
    if( negFlag ) i = -i;
    sqlite3VdbeAddOp2(v, OP_Integer, i, iMem);
  }else{
    int c;
    i64 value;
    const char *z = pExpr->u.zToken;
    assert( z!=0 );
    c = sqlite3Atoi64(z, &value, sqlite3Strlen30(z), SQLITE_UTF8);
    if( c==0 || (c==2 && negFlag) ){
      char *zV;
      if( negFlag ){ value = c==2 ? SMALLEST_INT64 : -value; }
      zV = dup8bytes(v, (char*)&value);
      sqlite3VdbeAddOp4(v, OP_Int64, 0, iMem, 0, zV, P4_INT64);
    }else{
#ifdef SQLITE_OMIT_FLOATING_POINT
      sqlite3ErrorMsg(pParse, "oversized integer: %s%s", negFlag ? "-" : "", z);
#else
      codeReal(v, z, negFlag, iMem);
#endif
    }
  }
}